

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O1

void __thiscall
Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array(Array<Imf_2_5::Array2D<half>_> *this,long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar2 = uVar3;
  }
  plVar4 = (long *)operator_new__(uVar2);
  *plVar4 = size;
  if (size != 0) {
    memset((Array2D<half> *)(plVar4 + 1),0,((size * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  this->_data = (Array2D<half> *)(plVar4 + 1);
  this->_size = size;
  return;
}

Assistant:

Array (long size)			{_data = new T[size]; _size = size;}